

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_ls.c
# Opt level: O2

int idaLsDQJtimes(sunrealtype tt,N_Vector yy,N_Vector yp,N_Vector rr,N_Vector v,N_Vector Jv,
                 sunrealtype c_j,void *ida_mem,N_Vector work1,N_Vector work2)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  double dVar5;
  double local_78;
  IDAMem IDA_mem;
  N_Vector local_60;
  N_Vector local_58;
  N_Vector local_50;
  sunrealtype local_48;
  sunrealtype local_40;
  IDALsMem idals_mem;
  
  local_48 = tt;
  local_40 = c_j;
  iVar2 = idaLs_AccessLMem(ida_mem,"idaLsDQJtimes",&IDA_mem,&idals_mem);
  if (iVar2 == 0) {
    local_58 = yy;
    local_50 = yp;
    iVar2 = SUNLinSolGetID(idals_mem->LS);
    local_60 = rr;
    if (iVar2 - 7U < 2) {
      local_78 = idals_mem->nrmfac * idals_mem->dqincfac;
    }
    else {
      local_78 = idals_mem->dqincfac;
      dVar5 = (double)N_VWrmsNorm(v,IDA_mem->ida_ewt);
      local_78 = local_78 / dVar5;
    }
    bVar1 = true;
    iVar2 = 3;
    while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
      N_VLinearSum(local_78,0x3ff0000000000000,v,local_58,work1);
      N_VLinearSum(local_78 * local_40,0x3ff0000000000000,v,local_50,work2);
      iVar3 = (*idals_mem->jt_res)(local_48,work1,work2,Jv,IDA_mem->ida_user_data);
      idals_mem->nreDQ = idals_mem->nreDQ + 1;
      if (iVar3 == 0) goto LAB_00112f25;
      if (iVar3 < 0) {
        return -1;
      }
      local_78 = local_78 * 0.25;
      bVar1 = false;
    }
    if (bVar1) {
LAB_00112f25:
      N_VLinearSum(1.0 / local_78,-(1.0 / local_78),Jv,local_60,Jv);
      iVar2 = 0;
    }
    else {
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int idaLsDQJtimes(sunrealtype tt, N_Vector yy, N_Vector yp, N_Vector rr,
                  N_Vector v, N_Vector Jv, sunrealtype c_j, void* ida_mem,
                  N_Vector work1, N_Vector work2)
{
  IDAMem IDA_mem;
  IDALsMem idals_mem;
  N_Vector y_tmp, yp_tmp;
  sunrealtype sig, siginv;
  int iter, retval;
  SUNLinearSolver_ID LSID;

  /* access IDALsMem structure */
  retval = idaLs_AccessLMem(ida_mem, __func__, &IDA_mem, &idals_mem);
  if (retval != IDALS_SUCCESS) { return (retval); }

  LSID = SUNLinSolGetID(idals_mem->LS);
  if (LSID == SUNLINEARSOLVER_SPGMR || LSID == SUNLINEARSOLVER_SPFGMR)
  {
    sig = idals_mem->nrmfac * idals_mem->dqincfac;
  }
  else { sig = idals_mem->dqincfac / N_VWrmsNorm(v, IDA_mem->ida_ewt); }

  /* Rename work1 and work2 for readibility */
  y_tmp  = work1;
  yp_tmp = work2;

  for (iter = 0; iter < MAX_ITERS; iter++)
  {
    /* Set y_tmp = yy + sig*v, yp_tmp = yp + cj*sig*v. */
    N_VLinearSum(sig, v, ONE, yy, y_tmp);
    N_VLinearSum(c_j * sig, v, ONE, yp, yp_tmp);

    /* Call res for Jv = F(t, y_tmp, yp_tmp), and return if it failed. */
    retval = idals_mem->jt_res(tt, y_tmp, yp_tmp, Jv, IDA_mem->ida_user_data);
    idals_mem->nreDQ++;
    if (retval == 0) { break; }
    if (retval < 0) { return (-1); }

    sig *= PT25;
  }

  if (retval > 0) { return (+1); }

  /* Set Jv to [Jv - rr]/sig and return. */
  siginv = ONE / sig;
  N_VLinearSum(siginv, Jv, -siginv, rr, Jv);

  return (0);
}